

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_file_sink-inl.h
# Opt level: O0

int __thiscall
spdlog::sinks::basic_file_sink<std::mutex>::truncate
          (basic_file_sink<std::mutex> *this,char *__file,__off_t __length)

{
  int extraout_EAX;
  lock_guard<std::mutex> lock;
  file_helper *in_stack_00000020;
  lock_guard<std::mutex> *in_stack_ffffffffffffffe0;
  
  CLI::std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffe0,(mutex_type *)this);
  details::file_helper::reopen(in_stack_00000020,lock._M_device._7_1_);
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x69871e);
  return extraout_EAX;
}

Assistant:

SPDLOG_INLINE void basic_file_sink<Mutex>::truncate() {
    std::lock_guard<Mutex> lock(base_sink<Mutex>::mutex_);
    file_helper_.reopen(true);
}